

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O2

void mg_mqtt_prepend_header(mg_connection *nc,uint8_t cmd,uint8_t flags,size_t len)

{
  ulong uVar1;
  bool bVar2;
  size_t len_00;
  size_t sVar3;
  uint8_t buf [9];
  
  uVar1 = (nc->send_mbuf).len;
  if (len <= uVar1) {
    buf[0] = cmd << 4 | flags;
    len_00 = 1;
    sVar3 = len;
    do {
      buf[len_00] = (0x7f < sVar3) << 7 | (byte)sVar3 & 0x7f;
      len_00 = len_00 + 1;
      bVar2 = 0x7f < sVar3;
      sVar3 = sVar3 >> 7;
    } while (bVar2);
    mbuf_insert(&nc->send_mbuf,uVar1 - len,buf,len_00);
    return;
  }
  __assert_fail("nc->send_mbuf.len >= len",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/CryptXor[P]jetservd/mongoose.c"
                ,0x1cdc,
                "void mg_mqtt_prepend_header(struct mg_connection *, uint8_t, uint8_t, size_t)");
}

Assistant:

static void mg_mqtt_prepend_header(struct mg_connection *nc, uint8_t cmd,
                                   uint8_t flags, size_t len) {
    size_t off = nc->send_mbuf.len - len;
    uint8_t header = cmd << 4 | (uint8_t) flags;

    uint8_t buf[1 + sizeof(size_t)];
    uint8_t *vlen = &buf[1];

    assert(nc->send_mbuf.len >= len);

    buf[0] = header;

    /* mqtt variable length encoding */
    do {
        *vlen = len % 0x80;
        len /= 0x80;
        if (len > 0) *vlen |= 0x80;
        vlen++;
    } while (len > 0);

    mbuf_insert(&nc->send_mbuf, off, buf, vlen - buf);
}